

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

bool __thiscall grammar::is_terminal_symbol(grammar *this,symbol_t *symbol)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  size_type sVar4;
  
  p_Var3 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
  while (((_Rb_tree_header *)p_Var3 != p_Var1 &&
         (bVar2 = operator==((this_t *)&p_Var3[1]._M_parent,symbol), !bVar2))) {
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (sVar4 = std::
              map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
              ::count(&this->rules,(key_type *)(p_Var3 + 1)), sVar4 == 0)) {
    bVar2 = using_symbol(this,symbol);
    return bVar2;
  }
  return false;
}

Assistant:

[[maybe_unused]] bool grammar::is_terminal_symbol(symbol_t symbol) const {
    if (auto iter = std::find_if(
            symbols.begin(), symbols.end(),
            [&symbol](auto & entry) { return entry.second == symbol; });
        iter != symbols.end())
        return this->rules.count(iter->first) == 0
               and this->using_symbol(symbol);
    else
        return false;
}